

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O0

FT_Error FT_Outline_Decompose(FT_Outline *outline,FT_Outline_Funcs *func_interface,void *user)

{
  int iVar1;
  long lVar2;
  byte *pbVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  FT_Vector *pFVar7;
  byte bVar8;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_128;
  long local_118;
  long local_110;
  long local_108;
  long local_100;
  undefined1 local_f8 [8];
  FT_Vector vec_2;
  FT_Vector vec2;
  FT_Vector vec1;
  FT_Vector v_middle;
  FT_Vector vec_1;
  FT_Vector vec;
  FT_Int last;
  FT_Pos delta;
  FT_Int shift;
  FT_Int tag;
  FT_UInt first;
  FT_Int n;
  FT_Error error;
  char *tags;
  FT_Vector *limit;
  FT_Vector *point;
  FT_Vector v_start;
  FT_Vector v_control;
  FT_Vector v_last;
  void *user_local;
  FT_Outline_Funcs *func_interface_local;
  FT_Outline *outline_local;
  
  if (outline == (FT_Outline *)0x0) {
    outline_local._4_4_ = 0x14;
  }
  else {
    if (func_interface != (FT_Outline_Funcs *)0x0) {
      iVar1 = func_interface->shift;
      lVar2 = func_interface->delta;
      shift = 0;
      tag = 0;
      do {
        if (outline->n_contours <= tag) {
          return 0;
        }
        iVar5 = (int)outline->contours[tag];
        if (iVar5 < 0) {
          return 0x14;
        }
        tags = (char *)(outline->points + iVar5);
        local_100 = outline->points[(uint)shift].x;
        local_108 = outline->points[(uint)shift].y;
        bVar8 = (byte)iVar1;
        if (local_100 < 0) {
          local_100 = -(-local_100 << (bVar8 & 0x3f));
        }
        else {
          local_100 = local_100 << (bVar8 & 0x3f);
        }
        v_start.y = local_100 - lVar2;
        if (local_108 < 0) {
          local_108 = -(-local_108 << (bVar8 & 0x3f));
        }
        else {
          local_108 = local_108 << (bVar8 & 0x3f);
        }
        local_110 = outline->points[iVar5].x;
        local_118 = outline->points[iVar5].y;
        if (local_110 < 0) {
          local_110 = -(-local_110 << (bVar8 & 0x3f));
        }
        else {
          local_110 = local_110 << (bVar8 & 0x3f);
        }
        point = (FT_Vector *)(local_110 - lVar2);
        if (local_118 < 0) {
          local_118 = -(-local_118 << (bVar8 & 0x3f));
        }
        else {
          local_118 = local_118 << (bVar8 & 0x3f);
        }
        v_start.x = local_118 - lVar2;
        limit = outline->points + (uint)shift;
        _n = (byte *)(outline->tags + (uint)shift);
        if ((*_n & 3) == 2) {
          return 0x14;
        }
        pFVar7 = (FT_Vector *)v_start.y;
        lVar4 = local_108 - lVar2;
        if ((*_n & 3) == 0) {
          if ((outline->tags[iVar5] & 3U) == 1) {
            tags = (char *)((long)tags + -0x10);
          }
          else {
            point = (FT_Vector *)((v_start.y + (long)point) / 2);
            v_start.x = ((local_108 - lVar2) + v_start.x) / 2;
          }
          limit = limit + -1;
          _n = _n + -1;
          pFVar7 = point;
          lVar4 = v_start.x;
        }
        v_start.x = lVar4;
        point = pFVar7;
        iVar6 = (*func_interface->move_to)((FT_Vector *)&point,user);
        pbVar3 = _n;
        while( true ) {
          while( true ) {
            while( true ) {
              if (iVar6 != 0) {
                return iVar6;
              }
              if (tags <= limit) {
                first = (*func_interface->line_to)((FT_Vector *)&point,user);
                goto LAB_001483fa;
              }
              pFVar7 = limit + 1;
              _n = pbVar3 + 1;
              if ((*_n & 3) != 0) break;
              if (pFVar7->x < 0) {
                local_138 = -(-pFVar7->x << (bVar8 & 0x3f));
              }
              else {
                local_138 = pFVar7->x << (bVar8 & 0x3f);
              }
              v_start.y = local_138 - lVar2;
              if (limit[1].y < 0) {
                local_140 = -(-limit[1].y << (bVar8 & 0x3f));
              }
              else {
                local_140 = limit[1].y << (bVar8 & 0x3f);
              }
              v_control.x = local_140 - lVar2;
              limit = pFVar7;
              while( true ) {
                if (tags <= limit) {
                  first = (*func_interface->conic_to)
                                    ((FT_Vector *)&v_start.y,(FT_Vector *)&point,user);
                  goto LAB_001483fa;
                }
                pFVar7 = limit + 1;
                _n = _n + 1;
                if (pFVar7->x < 0) {
                  local_148 = -(-pFVar7->x << (bVar8 & 0x3f));
                }
                else {
                  local_148 = pFVar7->x << (bVar8 & 0x3f);
                }
                v_middle.y = local_148 - lVar2;
                if (limit[1].y < 0) {
                  local_150 = -(-limit[1].y << (bVar8 & 0x3f));
                }
                else {
                  local_150 = limit[1].y << (bVar8 & 0x3f);
                }
                vec_1.x = local_150 - lVar2;
                limit = pFVar7;
                if ((*_n & 3) == 1) break;
                if ((*_n & 3) != 0) {
                  return 0x14;
                }
                vec1.y = (v_start.y + v_middle.y) / 2;
                v_middle.x = (v_control.x + vec_1.x) / 2;
                iVar6 = (*func_interface->conic_to)
                                  ((FT_Vector *)&v_start.y,(FT_Vector *)&vec1.y,user);
                if (iVar6 != 0) {
                  return iVar6;
                }
                v_start.y = v_middle.y;
                v_control.x = vec_1.x;
              }
              iVar6 = (*func_interface->conic_to)
                                ((FT_Vector *)&v_start.y,(FT_Vector *)&v_middle.y,user);
              pbVar3 = _n;
            }
            if ((*_n & 3) != 1) break;
            if (pFVar7->x < 0) {
              local_128 = -(-pFVar7->x << (bVar8 & 0x3f));
            }
            else {
              local_128 = pFVar7->x << (bVar8 & 0x3f);
            }
            vec_1.y = local_128 - lVar2;
            iVar6 = (*func_interface->line_to)((FT_Vector *)&vec_1.y,user);
            pbVar3 = _n;
            limit = pFVar7;
          }
          if (tags < limit + 2) {
            return 0x14;
          }
          if ((pbVar3[2] & 3) != 2) {
            return 0x14;
          }
          pFVar7 = limit + 3;
          if (limit[1].x < 0) {
            local_158 = -(-limit[1].x << (bVar8 & 0x3f));
          }
          else {
            local_158 = limit[1].x << (bVar8 & 0x3f);
          }
          vec2.y = local_158 - lVar2;
          if (limit[1].y < 0) {
            local_160 = -(-limit[1].y << (bVar8 & 0x3f));
          }
          else {
            local_160 = limit[1].y << (bVar8 & 0x3f);
          }
          vec1.x = local_160 - lVar2;
          if (limit[2].x < 0) {
            local_168 = -(-limit[2].x << (bVar8 & 0x3f));
          }
          else {
            local_168 = limit[2].x << (bVar8 & 0x3f);
          }
          vec_2.y = local_168 - lVar2;
          if (limit[2].y < 0) {
            local_170 = -(-limit[2].y << (bVar8 & 0x3f));
          }
          else {
            local_170 = limit[2].y << (bVar8 & 0x3f);
          }
          vec2.x = local_170 - lVar2;
          if (tags < pFVar7) break;
          if (pFVar7->x < 0) {
            local_178 = -(-pFVar7->x << (bVar8 & 0x3f));
          }
          else {
            local_178 = pFVar7->x << (bVar8 & 0x3f);
          }
          local_f8 = (undefined1  [8])(local_178 - lVar2);
          if (limit[3].y < 0) {
            local_180 = -(-limit[3].y << (bVar8 & 0x3f));
          }
          else {
            local_180 = limit[3].y << (bVar8 & 0x3f);
          }
          vec_2.x = local_180 - lVar2;
          iVar6 = (*func_interface->cubic_to)
                            ((FT_Vector *)&vec2.y,(FT_Vector *)&vec_2.y,(FT_Vector *)local_f8,user);
          pbVar3 = pbVar3 + 3;
          limit = pFVar7;
        }
        first = (*func_interface->cubic_to)
                          ((FT_Vector *)&vec2.y,(FT_Vector *)&vec_2.y,(FT_Vector *)&point,user);
LAB_001483fa:
        if (first != 0) {
          return first;
        }
        shift = iVar5 + 1;
        tag = tag + 1;
      } while( true );
    }
    outline_local._4_4_ = 6;
  }
  return outline_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Decompose( FT_Outline*              outline,
                        const FT_Outline_Funcs*  func_interface,
                        void*                    user )
  {
#undef  SCALED
#define SCALED( x )  ( ( (x) < 0 ? -( -(x) << shift )             \
                                 :  (  (x) << shift ) ) - delta )

    FT_Vector   v_last;
    FT_Vector   v_control;
    FT_Vector   v_start;

    FT_Vector*  point;
    FT_Vector*  limit;
    char*       tags;

    FT_Error    error;

    FT_Int   n;         /* index of contour in outline     */
    FT_UInt  first;     /* index of first point in contour */
    FT_Int   tag;       /* current point's state           */

    FT_Int   shift;
    FT_Pos   delta;


    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !func_interface )
      return FT_THROW( Invalid_Argument );

    shift = func_interface->shift;
    delta = func_interface->delta;
    first = 0;

    for ( n = 0; n < outline->n_contours; n++ )
    {
      FT_Int  last;  /* index of last point in contour */


      FT_TRACE5(( "FT_Outline_Decompose: Outline %d\n", n ));

      last = outline->contours[n];
      if ( last < 0 )
        goto Invalid_Outline;
      limit = outline->points + last;

      v_start   = outline->points[first];
      v_start.x = SCALED( v_start.x );
      v_start.y = SCALED( v_start.y );

      v_last   = outline->points[last];
      v_last.x = SCALED( v_last.x );
      v_last.y = SCALED( v_last.y );

      v_control = v_start;

      point = outline->points + first;
      tags  = outline->tags   + first;
      tag   = FT_CURVE_TAG( tags[0] );

      /* A contour cannot start with a cubic control point! */
      if ( tag == FT_CURVE_TAG_CUBIC )
        goto Invalid_Outline;

      /* check first point to determine origin */
      if ( tag == FT_CURVE_TAG_CONIC )
      {
        /* first point is conic control.  Yes, this happens. */
        if ( FT_CURVE_TAG( outline->tags[last] ) == FT_CURVE_TAG_ON )
        {
          /* start at last point if it is on the curve */
          v_start = v_last;
          limit--;
        }
        else
        {
          /* if both first and last points are conic,         */
          /* start at their middle and record its position    */
          /* for closure                                      */
          v_start.x = ( v_start.x + v_last.x ) / 2;
          v_start.y = ( v_start.y + v_last.y ) / 2;

       /* v_last = v_start; */
        }
        point--;
        tags--;
      }

      FT_TRACE5(( "  move to (%.2f, %.2f)\n",
                  v_start.x / 64.0, v_start.y / 64.0 ));
      error = func_interface->move_to( &v_start, user );
      if ( error )
        goto Exit;

      while ( point < limit )
      {
        point++;
        tags++;

        tag = FT_CURVE_TAG( tags[0] );
        switch ( tag )
        {
        case FT_CURVE_TAG_ON:  /* emit a single line_to */
          {
            FT_Vector  vec;


            vec.x = SCALED( point->x );
            vec.y = SCALED( point->y );

            FT_TRACE5(( "  line to (%.2f, %.2f)\n",
                        vec.x / 64.0, vec.y / 64.0 ));
            error = func_interface->line_to( &vec, user );
            if ( error )
              goto Exit;
            continue;
          }

        case FT_CURVE_TAG_CONIC:  /* consume conic arcs */
          v_control.x = SCALED( point->x );
          v_control.y = SCALED( point->y );

        Do_Conic:
          if ( point < limit )
          {
            FT_Vector  vec;
            FT_Vector  v_middle;


            point++;
            tags++;
            tag = FT_CURVE_TAG( tags[0] );

            vec.x = SCALED( point->x );
            vec.y = SCALED( point->y );

            if ( tag == FT_CURVE_TAG_ON )
            {
              FT_TRACE5(( "  conic to (%.2f, %.2f)"
                          " with control (%.2f, %.2f)\n",
                          vec.x / 64.0, vec.y / 64.0,
                          v_control.x / 64.0, v_control.y / 64.0 ));
              error = func_interface->conic_to( &v_control, &vec, user );
              if ( error )
                goto Exit;
              continue;
            }

            if ( tag != FT_CURVE_TAG_CONIC )
              goto Invalid_Outline;

            v_middle.x = ( v_control.x + vec.x ) / 2;
            v_middle.y = ( v_control.y + vec.y ) / 2;

            FT_TRACE5(( "  conic to (%.2f, %.2f)"
                        " with control (%.2f, %.2f)\n",
                        v_middle.x / 64.0, v_middle.y / 64.0,
                        v_control.x / 64.0, v_control.y / 64.0 ));
            error = func_interface->conic_to( &v_control, &v_middle, user );
            if ( error )
              goto Exit;

            v_control = vec;
            goto Do_Conic;
          }

          FT_TRACE5(( "  conic to (%.2f, %.2f)"
                      " with control (%.2f, %.2f)\n",
                      v_start.x / 64.0, v_start.y / 64.0,
                      v_control.x / 64.0, v_control.y / 64.0 ));
          error = func_interface->conic_to( &v_control, &v_start, user );
          goto Close;

        default:  /* FT_CURVE_TAG_CUBIC */
          {
            FT_Vector  vec1, vec2;


            if ( point + 1 > limit                             ||
                 FT_CURVE_TAG( tags[1] ) != FT_CURVE_TAG_CUBIC )
              goto Invalid_Outline;

            point += 2;
            tags  += 2;

            vec1.x = SCALED( point[-2].x );
            vec1.y = SCALED( point[-2].y );

            vec2.x = SCALED( point[-1].x );
            vec2.y = SCALED( point[-1].y );

            if ( point <= limit )
            {
              FT_Vector  vec;


              vec.x = SCALED( point->x );
              vec.y = SCALED( point->y );

              FT_TRACE5(( "  cubic to (%.2f, %.2f)"
                          " with controls (%.2f, %.2f) and (%.2f, %.2f)\n",
                          vec.x / 64.0, vec.y / 64.0,
                          vec1.x / 64.0, vec1.y / 64.0,
                          vec2.x / 64.0, vec2.y / 64.0 ));
              error = func_interface->cubic_to( &vec1, &vec2, &vec, user );
              if ( error )
                goto Exit;
              continue;
            }

            FT_TRACE5(( "  cubic to (%.2f, %.2f)"
                        " with controls (%.2f, %.2f) and (%.2f, %.2f)\n",
                        v_start.x / 64.0, v_start.y / 64.0,
                        vec1.x / 64.0, vec1.y / 64.0,
                        vec2.x / 64.0, vec2.y / 64.0 ));
            error = func_interface->cubic_to( &vec1, &vec2, &v_start, user );
            goto Close;
          }
        }
      }

      /* close the contour with a line segment */
      FT_TRACE5(( "  line to (%.2f, %.2f)\n",
                  v_start.x / 64.0, v_start.y / 64.0 ));
      error = func_interface->line_to( &v_start, user );

    Close:
      if ( error )
        goto Exit;

      first = (FT_UInt)last + 1;
    }

    FT_TRACE5(( "FT_Outline_Decompose: Done\n", n ));
    return FT_Err_Ok;

  Exit:
    FT_TRACE5(( "FT_Outline_Decompose: Error 0x%x\n", error ));
    return error;

  Invalid_Outline:
    return FT_THROW( Invalid_Outline );
  }